

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_MeshParameters::GeometrySettingsHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_MeshParameters *this,bool bIgnoreSubDParameters)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  uchar u;
  ON_SubDComponentLocation OVar4;
  undefined7 in_register_00000011;
  ON_SHA1 sha1;
  ON_SubDDisplayParameters subd_params;
  ON_SHA1 OStack_e8;
  ON_SubDDisplayParameters local_68;
  
  if (((int)CONCAT71(in_register_00000011,bIgnoreSubDParameters) != 0) ||
     (bVar3 = ON_SHA1_Hash::IsZeroDigest(&this->m_geometry_settings_hash), bVar3)) {
    ON_SHA1::ON_SHA1(&OStack_e8);
    ON_SHA1::AccumulateBool(&OStack_e8,this->m_bSimplePlanes);
    ON_SHA1::AccumulateBool(&OStack_e8,this->m_bRefine);
    ON_SHA1::AccumulateBool(&OStack_e8,this->m_bJaggedSeams);
    ON_SHA1::AccumulateUnsigned32(&OStack_e8,(uint)this->m_mesher);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_tolerance,0.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_relative_tolerance,0.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_min_edge_length,0.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_max_edge_length,0.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_grid_aspect_ratio,0.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    ON_SHA1::AccumulateInteger32(&OStack_e8,this->m_grid_min_count);
    ON_SHA1::AccumulateInteger32(&OStack_e8,this->m_grid_max_count);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_grid_angle_radians,3.141592653589793);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_refine_angle_radians,0.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    dVar1 = ON_MeshParameters_SHA1Double(this->m_grid_amplification,1.0);
    ON_SHA1::AccumulateDouble(&OStack_e8,dVar1);
    ON_SHA1::AccumulateUnsigned32(&OStack_e8,(uint)this->m_face_type);
    if (!bIgnoreSubDParameters) {
      ON_SubDDisplayParameters::DecodeFromUnsignedChar
                (&local_68,this->m_subd_mesh_parameters_as_char);
      bVar3 = ON_SubDDisplayParameters::DisplayDensityIsAbsolute(&local_68);
      ON_SHA1::AccumulateBool(&OStack_e8,bVar3);
      u = ON_SubDDisplayParameters::GetRawDisplayDensityForExperts(&local_68);
      ON_SHA1::AccumulateUnsigned8(&OStack_e8,u);
      OVar4 = ON_SubDDisplayParameters::MeshLocation(&local_68);
      ON_SHA1::AccumulateBool(&OStack_e8,OVar4 == ControlNet);
    }
    bVar3 = ON_UuidIsNotNil(&this->m_mesher_id);
    if (bVar3) {
      ON_SHA1::AccumulateId(&OStack_e8,&this->m_mesher_id);
      Internal_AccumulatePangolinParameters(this,&DefaultMesh,&OStack_e8);
    }
    if (bIgnoreSubDParameters) {
      ON_SHA1::Hash(__return_storage_ptr__,&OStack_e8);
      return __return_storage_ptr__;
    }
    ON_SHA1::Hash((ON_SHA1_Hash *)&local_68,&OStack_e8);
    *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
         (undefined4)local_68.m_reserved6;
    *(undefined8 *)(this->m_geometry_settings_hash).m_digest = local_68._0_8_;
    *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = local_68._8_8_;
  }
  *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) =
       *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10);
  uVar2 = *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8);
  *(undefined8 *)__return_storage_ptr__->m_digest =
       *(undefined8 *)(this->m_geometry_settings_hash).m_digest;
  *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = uVar2;
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_MeshParameters::GeometrySettingsHash(bool bIgnoreSubDParameters) const
{
  // Please discuss any changes with Dale Lear

  // These values are intentionally ignored.
  //   m_bCustomSettings
  //   m_bCustomSettingsEnabled
  //   m_bComputeCurvature
  //   m_bDoublePrecision
  //   m_bClosedObjectPostProcess
  //   m_texture_range
  //   If they are included here, Rhino will remesh when it should not because it treats
  //   Texture coordinates as a mutable property (const_cast widely used in Rhino).
  //   Curvature is added/removed from analysis mode as needed.
  //   Custom settings controls where the mesh settings come from and when they 
  //   match what was used to create an existing mesh, a remesh is extremely wasteful,
  //   ClosedObjectPostProcess is added/removed as needed and is a hack to cover up core bugs.

  if (bIgnoreSubDParameters || m_geometry_settings_hash.IsZeroDigest())
  {
    ON_SHA1 sha1;
    sha1.AccumulateBool(m_bSimplePlanes);
    sha1.AccumulateBool(m_bRefine);
    sha1.AccumulateBool(m_bJaggedSeams);
    sha1.AccumulateUnsigned32(m_mesher);
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_tolerance,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_relative_tolerance,0.0));

    // Do not include m_min_tolerance as a geometry setting.
    // It is a runtime lower bound clamp.
    // If it is included here, Rhino will remesh everytime model tolerance changes.
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_min_edge_length,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_max_edge_length,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_aspect_ratio,0.0));
    sha1.AccumulateInteger32(m_grid_min_count);
    sha1.AccumulateInteger32(m_grid_max_count);
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_angle_radians,ON_PI));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_refine_angle_radians,0.0));
    sha1.AccumulateDouble(ON_MeshParameters_SHA1Double(m_grid_amplification,1.0));
    sha1.AccumulateUnsigned32(m_face_type);

    if (false == bIgnoreSubDParameters)
    {
      // 2023-05-12, Pierre: Changes in RH-50501 make ON_MeshParameters::SetComputeCurvature also
      // act on the SubD mesh parameters, and I believe this is good (keeping the compute curvature bit
      // in sync between Brep meshing parameters and SubD mesh parameters). This means Breps with
      // compute curvature on also have non-default SubD meshing parameters (they always have the SubD
      // parameters, they just used to be default).
      // These values are intentionally ignored:
      //   m_reserved
      //   m_context
      //   m_bComputeCurvature
      //   m_reserved3
      //   m_reserved4
      //   m_reserved5
      //   m_reserved6
      //   m_reserved7
      //   m_terminator
      //   m_progress_reporter
      //   m_progress_reporter_interval
      ON_SubDDisplayParameters subd_params{
          ON_SubDDisplayParameters::DecodeFromUnsignedChar(m_subd_mesh_parameters_as_char)};
      sha1.AccumulateBool(subd_params.DisplayDensityIsAbsolute());
      sha1.AccumulateUnsigned8((ON__UINT8)subd_params.GetRawDisplayDensityForExperts());  // display density fits in a char
      sha1.AccumulateBool(subd_params.MeshLocation() == ON_SubDComponentLocation::ControlNet);
    }

    if (ON_UuidIsNotNil(m_mesher_id))
    {
      // The Pangolin parameters and any other, parameters we add in the future,
      // contribute to the SHA1 only when they differ from default values.
      // This keeps old SHA-1 values correct and prevents remeshing when openning
      // old files.
      sha1.AccumulateId(m_mesher_id);

      // Pangolin parameters
      Internal_AccumulatePangolinParameters(ON_MeshParameters::DefaultMesh, sha1);
    }
    
    if (bIgnoreSubDParameters)
      return sha1.Hash();

    m_geometry_settings_hash = sha1.Hash();
  }
  return m_geometry_settings_hash;
}